

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallHeapBlockAllocator.h
# Opt level: O1

char * __thiscall
Memory::SmallHeapBlockAllocator<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>::
InlinedAllocImpl<true>
          (SmallHeapBlockAllocator<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>
           *this,Recycler *recycler,size_t sizeCat,ObjectInfoBits attributes)

{
  SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  undefined4 *puVar5;
  FreeObject *pFVar6;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *pSVar7;
  undefined6 in_register_0000000a;
  FreeObject *this_00;
  FreeObject *pFVar8;
  AutoFilterExceptionRegion local_34 [2];
  AutoFilterExceptionRegion __autoFilterExceptionRegion;
  
  if (0x3ff < (uint)CONCAT62(in_register_0000000a,attributes)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.h"
                       ,0x74,"((attributes & InternalObjectInfoBitMask) == attributes)",
                       "(attributes & InternalObjectInfoBitMask) == attributes");
    if (!bVar3) goto LAB_00391c42;
    *puVar5 = 0;
  }
  if (((attributes & (WithBarrierBit|LeafBit)) == NoBit) && (DAT_015d641e != '\0')) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.h"
                       ,0x76,
                       "(!(Js::Configuration::Global.flags.ForceSoftwareWriteBarrier) || (attributes & WithBarrierBit) || (attributes & LeafBit))"
                       ,
                       "!CONFIG_FLAG(ForceSoftwareWriteBarrier) || (attributes & WithBarrierBit) || (attributes & LeafBit)"
                      );
    if (!bVar3) goto LAB_00391c42;
    *puVar5 = 0;
  }
  AutoFilterExceptionRegion::AutoFilterExceptionRegion(local_34,ExceptionType_All);
  pFVar6 = (FreeObject *)this->endAddress;
  this_00 = this->freeObjectList;
  pFVar8 = (FreeObject *)((long)&this_00->taggedNext + sizeCat);
  if (pFVar6 < pFVar8) {
    if (pFVar6 == (FreeObject *)0x0 && this_00 != (FreeObject *)0x0) {
      pFVar6 = FreeObject::GetNext(this_00);
      this->freeObjectList = pFVar6;
      this_00->taggedNext = -0x3535353535353536;
      if (this->endAddress != (char *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.h"
                           ,0xa6,"(!this->IsBumpAllocMode())","!this->IsBumpAllocMode()");
        if (!bVar3) goto LAB_00391c42;
        *puVar5 = 0;
      }
      if ((attributes & InternalObjectInfoBitMask) != NoBit && attributes != LeafBit) {
        pSVar7 = &this->heapBlock->super_SmallHeapBlockT<SmallAllocationBlockAttributes>;
        if (pSVar7 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
          if (((ulong)this_00 & 0xf) == 0 && (FreeObject *)0xffff < this_00) {
            pSVar7 = (SmallHeapBlockT<SmallAllocationBlockAttributes> *)
                     HeapBlockMap64::GetHeapBlock(&recycler->heapBlockMap,this_00);
          }
          else {
            pSVar7 = (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
          }
          if (pSVar7 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar5 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.h"
                               ,0xae,"(allocationHeapBlock != nullptr)",
                               "allocationHeapBlock != nullptr");
            if (!bVar3) goto LAB_00391c42;
            *puVar5 = 0;
          }
          if ((pSVar7->super_HeapBlock).heapBlockType == LargeBlockType) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar5 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.h"
                               ,0xaf,"(!allocationHeapBlock->IsLargeHeapBlock())",
                               "!allocationHeapBlock->IsLargeHeapBlock()");
            if (!bVar3) goto LAB_00391c42;
            *puVar5 = 0;
          }
        }
        if ((attributes & (FinalizeBit|TrackBit)) != NoBit) {
          this_00->taggedNext = (INT_PTR)&PTR_Finalize_014da980;
        }
        SmallHeapBlockT<SmallAllocationBlockAttributes>::SetAttributes
                  (pSVar7,this_00,(uchar)attributes);
      }
      if (this->heapBlock == (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
        if (((ulong)this_00 & 0xf) == 0 && (FreeObject *)0xffff < this_00) {
          pSVar7 = (SmallHeapBlockT<SmallAllocationBlockAttributes> *)
                   HeapBlockMap64::GetHeapBlock(&recycler->heapBlockMap,this_00);
        }
        else {
          pSVar7 = (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
        }
        if (pSVar7 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.h"
                             ,0xc2,"(heapBlock != nullptr)","heapBlock != nullptr");
          if (!bVar3) goto LAB_00391c42;
          *puVar5 = 0;
        }
        if ((pSVar7->super_HeapBlock).heapBlockType == LargeBlockType) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.h"
                             ,0xc3,"(!heapBlock->IsLargeHeapBlock())",
                             "!heapBlock->IsLargeHeapBlock()");
          if (!bVar3) goto LAB_00391c42;
          *puVar5 = 0;
        }
        SmallHeapBlockT<SmallAllocationBlockAttributes>::ClearExplicitFreeBitForObject
                  (pSVar7,this_00);
      }
      pSVar1 = this->heapBlock;
      if (pSVar1 != (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
        if (((ulong)this_00 & 0xf) != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                             ,0x24d,"(HeapInfo::IsAlignedAddress(objectAddress))",
                             "HeapInfo::IsAlignedAddress(objectAddress)");
          if (!bVar3) goto LAB_00391c42;
          *puVar5 = 0;
        }
        BVar4 = BVStatic<256UL>::TestAndClear
                          (&(pSVar1->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).
                            debugFreeBits,(uint)((ulong)this_00 >> 4) & 0xff);
        if (BVar4 == '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.h"
                             ,0xcd,"(isSet)","isSet");
          if (!bVar3) goto LAB_00391c42;
          *puVar5 = 0;
        }
      }
    }
    else {
      this_00 = (FreeObject *)0x0;
    }
  }
  else {
    if (pFVar6 == (FreeObject *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.h"
                         ,0x86,"(this->IsBumpAllocMode())","this->IsBumpAllocMode()");
      if (!bVar3) {
LAB_00391c42:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    TrackNativeAllocatedObjects(this);
    this->lastNonNativeBumpAllocatedBlock = (char *)this_00;
    this->freeObjectList = pFVar8;
    if ((attributes & InternalObjectInfoBitMask) != NoBit && attributes != LeafBit) {
      if ((attributes & (FinalizeBit|TrackBit)) != NoBit) {
        this_00->taggedNext = (INT_PTR)&PTR_Finalize_014da980;
      }
      SmallHeapBlockT<SmallAllocationBlockAttributes>::SetAttributes
                (&this->heapBlock->super_SmallHeapBlockT<SmallAllocationBlockAttributes>,this_00,
                 (uchar)attributes);
    }
  }
  AutoFilterExceptionRegion::~AutoFilterExceptionRegion(local_34);
  return (char *)this_00;
}

Assistant:

inline char*
SmallHeapBlockAllocator<TBlockType>::InlinedAllocImpl(Recycler * recycler, DECLSPEC_GUARD_OVERFLOW size_t sizeCat, ObjectInfoBits attributes)
{
    Assert((attributes & InternalObjectInfoBitMask) == attributes);
#ifdef RECYCLER_WRITE_BARRIER
    Assert(!CONFIG_FLAG(ForceSoftwareWriteBarrier) || (attributes & WithBarrierBit) || (attributes & LeafBit));
#endif

    AUTO_NO_EXCEPTION_REGION;
    if (canFaultInject)
    {
        FAULTINJECT_MEMORY_NOTHROW(_u("InlinedAllocImpl"), sizeCat);
    }

    char * memBlock = (char *)freeObjectList;
    char * nextCurrentAddress = memBlock + sizeCat;
    char * endAddress = this->endAddress;

    if (nextCurrentAddress <= endAddress)
    {
        // Bump Allocation
        Assert(this->IsBumpAllocMode());
#ifdef RECYCLER_TRACK_NATIVE_ALLOCATED_OBJECTS
        TrackNativeAllocatedObjects();
        lastNonNativeBumpAllocatedBlock = memBlock;
#endif
        freeObjectList = (FreeObject *)nextCurrentAddress;

        if (NeedSetAttributes(attributes))
        {
            if ((attributes & (FinalizeBit | TrackBit)) != 0)
            {
                // Make sure a valid vtable is installed as once the attributes have been set this allocation may be traced by background marking
                memBlock = (char *)new (memBlock) DummyVTableObject();
#if defined(_M_ARM32_OR_ARM64)
                // On ARM, make sure the v-table write is performed before setting the attributes
                MemoryBarrier();
#endif
            }
            heapBlock->SetAttributes(memBlock, (attributes & StoredObjectInfoBitMask));
        }

        return memBlock;
    }

    if (memBlock != nullptr && endAddress == nullptr)
    {
        // Free list allocation
        freeObjectList = ((FreeObject *)memBlock)->GetNext();
#ifdef RECYCLER_MEMORY_VERIFY
        ((FreeObject *)memBlock)->DebugFillNext();
#endif
        
        Assert(!this->IsBumpAllocMode());
        if (NeedSetAttributes(attributes))
        {
            TBlockType * allocationHeapBlock = this->heapBlock;
            if (allocationHeapBlock == nullptr)
            {
                Assert(this->IsExplicitFreeObjectListAllocMode());
                allocationHeapBlock = (TBlockType *)recycler->FindHeapBlock(memBlock);
                Assert(allocationHeapBlock != nullptr);
                Assert(!allocationHeapBlock->IsLargeHeapBlock());
            }

            if ((attributes & (FinalizeBit | TrackBit)) != 0)
            {
                // Make sure a valid vtable is installed as once the attributes have been set this allocation may be traced by background marking
                memBlock = (char *)new (memBlock) DummyVTableObject();
#if defined(_M_ARM32_OR_ARM64)
                // On ARM, make sure the v-table write is performed before setting the attributes
                MemoryBarrier();
#endif
            }
            allocationHeapBlock->SetAttributes(memBlock, (attributes & StoredObjectInfoBitMask));
        }

#ifdef RECYCLER_MEMORY_VERIFY
        if (this->IsExplicitFreeObjectListAllocMode())
        {
            HeapBlock* heapBlock = recycler->FindHeapBlock(memBlock);
            Assert(heapBlock != nullptr);
            Assert(!heapBlock->IsLargeHeapBlock());
            TBlockType* smallBlock = (TBlockType*)heapBlock;
            smallBlock->ClearExplicitFreeBitForObject(memBlock);
        }
#endif

#if DBG || defined(RECYCLER_STATS)
        if (!IsExplicitFreeObjectListAllocMode())
        {
            BOOL isSet = heapBlock->GetDebugFreeBitVector()->TestAndClear(heapBlock->GetAddressBitIndex(memBlock));
            Assert(isSet);
        }
#endif
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
        // If we are allocating during concurrent sweep we must mark the object to prevent it from being swept
        // in the ongoing sweep.
        if (heapBlock != nullptr && heapBlock->isPendingConcurrentSweepPrep)
        {
            AssertMsg(!this->isAllocatingFromNewBlock, "We shouldn't be tracking allocation to a new block; i.e. bump allocation; during concurrent sweep.");
            AssertMsg(!heapBlock->IsAnyFinalizableBlock(), "Allocations are not allowed to finalizable blocks during concurrent sweep.");
            AssertMsg(heapBlock->heapBucket->AllocationsStartedDuringConcurrentSweep(), "We shouldn't be allocating from this block while allocations are disabled.");

            // Explcitly mark this object and also clear the free bit.
            heapBlock->SetObjectMarkedBit(memBlock);
#if DBG || defined(RECYCLER_SLOW_CHECK_ENABLED)
            uint bitIndex = heapBlock->GetAddressBitIndex(memBlock);
            heapBlock->GetDebugFreeBitVector()->Clear(bitIndex);
            heapBlock->objectsMarkedDuringSweep++;
#endif

#ifdef RECYCLER_TRACE
            if (recycler->GetRecyclerFlagsTable().Trace.IsEnabled(Js::ConcurrentSweepPhase) && recycler->GetRecyclerFlagsTable().Trace.IsEnabled(Js::MemoryAllocationPhase) && CONFIG_FLAG_RELEASE(Verbose))
            {
                Output::Print(_u("[**33**]FreeListAlloc: Object 0x%p from HeapBlock 0x%p used for allocation during ConcurrentSweep [CollectionState: %d] \n"), memBlock, heapBlock, static_cast<CollectionState>(recycler->collectionState));
            }
#endif
        }
#endif
        return memBlock;
    }

    return nullptr;
}